

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example-misc.cc
# Opt level: O3

void demo_image(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  vector<double,_std::allocator<double>_> row;
  double z;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  image;
  Gnuplot gp;
  string local_268;
  long *local_240 [2];
  long local_230 [2];
  double local_220;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_218;
  undefined1 local_1f8 [456];
  
  paVar1 = &local_268.field_2;
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
  gnuplotio::Gnuplot::Gnuplot((Gnuplot *)local_1f8,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = 0;
  do {
    local_268._M_dataplus._M_p = (char *)0x0;
    local_268._M_string_length = 0;
    local_268.field_2._M_allocated_capacity = 0;
    local_220 = (double)(iVar4 + -0x32) / 5.0;
    local_220 = local_220 * local_220;
    iVar3 = -0x32;
    do {
      local_240[0] = (long *)cos(SQRT(((double)iVar3 / 5.0) * ((double)iVar3 / 5.0) + local_220));
      if (local_268._M_string_length == local_268.field_2._M_allocated_capacity) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_268,
                   (iterator)local_268._M_string_length,(double *)local_240);
      }
      else {
        *(long **)local_268._M_string_length = local_240[0];
        local_268._M_string_length = local_268._M_string_length + 8;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0x32);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&local_218,(value_type *)&local_268);
    if (local_268._M_dataplus._M_p != (char *)0x0) {
      operator_delete(local_268._M_dataplus._M_p,
                      local_268.field_2._M_allocated_capacity - (long)local_268._M_dataplus._M_p);
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"plot \'-\' binary",0xf);
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"array","");
  gnuplotio::Gnuplot::
  binfmt<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,gnuplotio::Mode2D>
            (&local_268,(Gnuplot *)local_1f8,&local_218,local_240);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1f8,local_268._M_dataplus._M_p,local_268._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"with image\n",0xb);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  gnuplotio::Gnuplot::
  sendBinary<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,gnuplotio::Mode2D>
            ((Gnuplot *)local_1f8,&local_218);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_218);
  gnuplotio::Gnuplot::~Gnuplot((Gnuplot *)local_1f8,&gnuplotio::Gnuplot::VTT);
  std::ios_base::~ios_base((ios_base *)(local_1f8 + 0xc0));
  return;
}

Assistant:

std::vector<std::tuple<double, double, double>> get_trefoil() {
    std::vector<std::tuple<double, double, double>> vecs;
    for(double alpha=0; alpha<1; alpha+=1.0/120.0) {
        double theta = alpha*2.0*3.14159;
        vecs.emplace_back(
            (2+cos(3*theta))*cos(2*theta),
            (2+cos(3*theta))*sin(2*theta),
            sin(3*theta)
        );
    }
    return vecs;
}